

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O3

void cali_set_global_double_byname(char *name,double val)

{
  Attribute attr;
  Caliper c;
  allocator<char> local_69;
  double local_68;
  Attribute local_60;
  string local_58;
  Caliper local_38;
  
  local_68 = val;
  cali::Caliper::Caliper(&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,name,&local_69);
  local_60 = cali::Caliper::create_attribute
                       (&local_38,&local_58,CALI_TYPE_DOUBLE,0x640,0,(Attribute *)0x0,(Variant *)0x0
                       );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)0x6;
  local_58._M_string_length = (size_type)local_68;
  cali::Caliper::set(&local_38,&local_60,(Variant *)&local_58);
  return;
}

Assistant:

void cali_set_global_double_byname(const char* name, double val)
{
    Caliper   c;
    Attribute attr =
        c.create_attribute(name, CALI_TYPE_DOUBLE, CALI_ATTR_GLOBAL | CALI_ATTR_UNALIGNED | CALI_ATTR_SKIP_EVENTS);

    // TODO: check for existing incompatible attribute key

    c.set(attr, cali_make_variant_from_double(val));
}